

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hvtool.cpp
# Opt level: O0

void __thiscall
HvFile::enumfileentries(HvFile *this,function<void_(std::shared_ptr<ent::base>)> *cb)

{
  uint32_t startofs;
  int iVar1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  element_type *peVar5;
  function<void_(std::shared_ptr<ent::base>)> local_40;
  uint local_1c;
  function<void_(std::shared_ptr<ent::base>)> *pfStack_18;
  uint i;
  function<void_(std::shared_ptr<ent::base>)> *cb_local;
  HvFile *this_local;
  
  local_1c = 0;
  pfStack_18 = cb;
  cb_local = (function<void_(std::shared_ptr<ent::base>)> *)this;
  while( true ) {
    uVar2 = (ulong)local_1c;
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->_offsets);
    if (sVar3 - 1 <= uVar2) break;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->_offsets,(ulong)local_1c);
    startofs = *pvVar4;
    peVar5 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )this);
    iVar1 = (*peVar5->_vptr_ReadWriter[6])();
    std::function<void_(std::shared_ptr<ent::base>)>::function(&local_40,cb);
    enumsectionentries(this,startofs,iVar1 - 0x5000,&local_40);
    std::function<void_(std::shared_ptr<ent::base>)>::~function(&local_40);
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void enumfileentries(std::function<void(ent::entry_ptr)> cb)
    {
        for (unsigned i=0 ; i<_offsets.size()-1 ; i++)
            enumsectionentries(_offsets[i], _r->size()-0x5000, cb);
    }